

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

int SUNMatScaleAdd_Band(realtype c,SUNMatrix A,SUNMatrix B)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  SUNMatrix A_00;
  int ml;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  
  iVar6 = SMCompatible_Band(A,B);
  if (iVar6 == 0) {
    iVar6 = -0x2bd;
  }
  else {
    pvVar2 = B->content;
    iVar6 = *(int *)((long)pvVar2 + 0xc);
    pvVar3 = A->content;
    iVar1 = *(int *)((long)pvVar3 + 0xc);
    if (iVar1 < iVar6) {
      iVar8 = *(int *)((long)pvVar3 + 0x10);
      ml = *(int *)((long)pvVar2 + 0x10);
    }
    else {
      ml = *(int *)((long)pvVar2 + 0x10);
      iVar8 = *(int *)((long)pvVar3 + 0x10);
      if (ml <= iVar8) {
        uVar5 = *(uint *)((long)pvVar3 + 4);
        if ((int)*(uint *)((long)pvVar3 + 4) < 1) {
          uVar5 = 0;
        }
        for (uVar11 = 0; uVar11 != uVar5; uVar11 = uVar11 + 1) {
          lVar10 = (long)*(int *)((long)pvVar3 + 0x14) * 8 +
                   *(long *)(*(long *)((long)pvVar3 + 0x28) + uVar11 * 8);
          iVar1 = *(int *)((long)pvVar2 + 0x14);
          lVar4 = *(long *)(*(long *)((long)pvVar2 + 0x28) + uVar11 * 8);
          for (lVar9 = (long)-iVar6; lVar9 <= ml; lVar9 = lVar9 + 1) {
            *(double *)(lVar10 + lVar9 * 8) =
                 *(double *)(lVar10 + lVar9 * 8) * c +
                 *(double *)((long)iVar1 * 8 + lVar4 + lVar9 * 8);
          }
        }
        return 0;
      }
    }
    if (ml < iVar8) {
      ml = iVar8;
    }
    if (iVar6 < iVar1) {
      iVar6 = iVar1;
    }
    iVar1 = *(int *)((long)pvVar3 + 4);
    iVar8 = iVar1 + -1;
    if (ml + iVar6 < iVar1) {
      iVar8 = ml + iVar6;
    }
    A_00 = SUNBandMatrixStorage(iVar1,iVar6,ml,iVar8,A->sunctx);
    pvVar2 = A->content;
    uVar7 = 0;
    uVar11 = (ulong)*(uint *)((long)pvVar2 + 4);
    if ((int)*(uint *)((long)pvVar2 + 4) < 1) {
      uVar11 = uVar7;
    }
    for (; uVar7 != uVar11; uVar7 = uVar7 + 1) {
      iVar6 = *(int *)((long)pvVar2 + 0x14);
      lVar4 = *(long *)(*(long *)((long)pvVar2 + 0x28) + uVar7 * 8);
      iVar1 = *(int *)((long)A_00->content + 0x14);
      lVar9 = *(long *)(*(long *)((long)A_00->content + 0x28) + uVar7 * 8);
      iVar8 = *(int *)((long)pvVar2 + 0x10);
      for (lVar10 = (long)-*(int *)((long)pvVar2 + 0xc); lVar10 <= iVar8; lVar10 = lVar10 + 1) {
        *(double *)((long)iVar1 * 8 + lVar9 + lVar10 * 8) =
             *(double *)((long)iVar6 * 8 + lVar4 + lVar10 * 8) * c;
      }
    }
    pvVar3 = B->content;
    uVar7 = 0;
    uVar11 = (ulong)*(uint *)((long)pvVar3 + 4);
    if ((int)*(uint *)((long)pvVar3 + 4) < 1) {
      uVar11 = uVar7;
    }
    for (; uVar7 != uVar11; uVar7 = uVar7 + 1) {
      iVar6 = *(int *)((long)pvVar3 + 0x14);
      lVar4 = *(long *)(*(long *)((long)pvVar3 + 0x28) + uVar7 * 8);
      lVar9 = (long)*(int *)((long)A_00->content + 0x14) * 8 +
              *(long *)(*(long *)((long)A_00->content + 0x28) + uVar7 * 8);
      iVar1 = *(int *)((long)pvVar3 + 0x10);
      for (lVar10 = (long)-*(int *)((long)pvVar3 + 0xc); lVar10 <= iVar1; lVar10 = lVar10 + 1) {
        *(double *)(lVar9 + lVar10 * 8) =
             *(double *)((long)iVar6 * 8 + lVar4 + lVar10 * 8) + *(double *)(lVar9 + lVar10 * 8);
      }
    }
    free(*(void **)((long)pvVar2 + 0x18));
    pvVar2 = A->content;
    *(undefined8 *)((long)pvVar2 + 0x18) = 0;
    free(*(void **)((long)pvVar2 + 0x28));
    free(A->content);
    A->content = (void *)0x0;
    A->content = A_00->content;
    A_00->content = (void *)0x0;
    SUNMatDestroy_Band(A_00);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int SUNMatScaleAdd_Band(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j;
  realtype *A_colj, *B_colj;

  /* Verify that A and B are compatible */
  if (!SMCompatible_Band(A, B))
    return SUNMAT_ILL_INPUT;

  /* Call separate routine in B has larger bandwidth(s) than A */
  if ( (SM_UBAND_B(B) > SM_UBAND_B(A)) ||
       (SM_LBAND_B(B) > SM_LBAND_B(A)) ) {
    return SMScaleAddNew_Band(c,A,B);
  }

  /* Otherwise, perform operation in-place */
  for (j=0; j<SM_COLUMNS_B(A); j++) {
    A_colj = SM_COLUMN_B(A,j);
    B_colj = SM_COLUMN_B(B,j);
    for (i=-SM_UBAND_B(B); i<=SM_LBAND_B(B); i++)
      A_colj[i] = c*A_colj[i] + B_colj[i];
  }
  return SUNMAT_SUCCESS;
}